

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

int __thiscall obx::Store::close(Store *this,int __fd)

{
  __pointer_type pOVar1;
  char cVar2;
  int extraout_EAX;
  int iVar3;
  shared_ptr<obx::Closable> syncClient;
  __shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_48._M_ptr = (element_type *)0x0;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::mutex::lock(&this->syncClientMutex_);
  std::__shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_48,
             &(this->syncClient_).super___shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2>);
  local_38._M_ptr = (element_type *)0x0;
  local_38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->syncClient_).super___shared_ptr<obx::Closable,_(__gnu_cxx::_Lock_policy)2>,
             &local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  pthread_mutex_unlock((pthread_mutex_t *)&this->syncClientMutex_);
  if (local_48._M_ptr != (element_type *)0x0) {
    cVar2 = (**(code **)(*(long *)local_48._M_ptr + 0x10))();
    if (cVar2 == '\0') {
      if ((local_48._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (1 < (local_48._M_refcount._M_pi)->_M_use_count)) {
        printf("SyncClient still active with %ld references when store got closed\n",
               (ulong)((local_48._M_refcount._M_pi)->_M_use_count - 1));
      }
      (**(code **)(*(long *)local_48._M_ptr + 0x18))();
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  iVar3 = extraout_EAX;
  if (this->owned_ == true) {
    LOCK();
    pOVar1 = (this->cStore_)._M_b._M_p;
    (this->cStore_)._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    iVar3 = obx_store_close(pOVar1);
  }
  return iVar3;
}

Assistant:

void Store::close() {
    {
        // Clean up SyncClient by explicitly closing it, even if it isn't the only shared_ptr to the instance.
        // This prevents invalid use of store after it's been closed.
        std::shared_ptr<Closable> syncClient;
        {
            std::lock_guard<std::mutex> lock(syncClientMutex_);
            syncClient = std::move(syncClient_);
            syncClient_ = nullptr;  // to make the current state obvious
        }

        if (syncClient && !syncClient->isClosed()) {
#ifndef NDEBUG  // todo we probably want our LOG macros here too
            long useCount = syncClient.use_count();
            if (useCount > 1) {  // print external refs only thus "- 1"
                printf("SyncClient still active with %ld references when store got closed\n", (useCount - 1));
            }
#endif  // NDEBUG
            syncClient->close();
        }
    }

    if (owned_) {
        OBX_store* storeToClose = cStore_.exchange(nullptr);  // Close exactly once
        obx_store_close(storeToClose);
    }
}